

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.c
# Opt level: O1

void invalidate_attrs(tgestate_t *state,uint8_t *start,int width,int height)

{
  zxspectrum_t *pzVar1;
  int iVar2;
  zxbox_t dirty;
  zxbox_t local_10;
  
  pzVar1 = state->speccy;
  iVar2 = (int)start - (int)pzVar1;
  local_10.y1 = 0xc0 - (iVar2 + -0x1830 >> 2 & 0xfffffff8U);
  local_10.y0 = local_10.y1 - height;
  local_10.x0 = iVar2 * 8 - 0xc180U & 0xff;
  local_10.x1 = width + local_10.x0;
  (*pzVar1->draw)(pzVar1,&local_10);
  return;
}

Assistant:

void invalidate_attrs(tgestate_t *state,
                      uint8_t    *start,
                      int         width,
                      int         height)
{
  uint8_t   *base = &state->speccy->screen.pixels[SCREEN_BITMAP_LENGTH];
  ptrdiff_t  offset;
  int        x,y;
  zxbox_t    dirty;

  offset = start - base;

  /* Convert attribute offset to cartesian for the interface. */
  x = (offset & 31) * 8;
  y = (int) offset >> 5;
  y = 23 - y;     /* flip */
  y = y + 1;      /* inclusive lower bound becomes exclusive upper */
  y = y * 8;      /* scale */
  y = y - height; /* get min-y */

  dirty.x0 = x;
  dirty.y0 = y;
  dirty.x1 = x + width;
  dirty.y1 = y + height;
  state->speccy->draw(state->speccy, &dirty);
}